

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::is_identity(matrix4d *m)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  dVar1 = m->m[0][0];
  if (-1 < (long)dVar1) {
    uVar4 = (long)dVar1 + 0xc010000000000000;
    uVar3 = -uVar4;
    if (0 < (long)uVar4) {
      uVar3 = uVar4;
    }
    if (uVar3 < 2) {
      dVar1 = m->m[0][1];
      bVar2 = ABS(dVar1) == 0.0;
      if (-1 < (long)dVar1) {
        bVar2 = (ulong)dVar1 < 2;
      }
      if (bVar2) {
        dVar1 = m->m[0][2];
        bVar2 = (ulong)dVar1 < 2;
        if ((long)dVar1 < 0) {
          bVar2 = ABS(dVar1) == 0.0;
        }
        if (bVar2) {
          dVar1 = m->m[0][3];
          bVar2 = (ulong)dVar1 < 2;
          if ((long)dVar1 < 0) {
            bVar2 = ABS(dVar1) == 0.0;
          }
          if (bVar2) {
            dVar1 = m->m[1][0];
            bVar2 = (ulong)dVar1 < 2;
            if ((long)dVar1 < 0) {
              bVar2 = ABS(dVar1) == 0.0;
            }
            if ((bVar2) && (dVar1 = m->m[1][1], -1 < (long)dVar1)) {
              uVar4 = (long)dVar1 + 0xc010000000000000;
              uVar3 = -uVar4;
              if (0 < (long)uVar4) {
                uVar3 = uVar4;
              }
              if (uVar3 < 2) {
                dVar1 = m->m[1][2];
                bVar2 = (ulong)dVar1 < 2;
                if ((long)dVar1 < 0) {
                  bVar2 = ABS(dVar1) == 0.0;
                }
                if (bVar2) {
                  dVar1 = m->m[1][3];
                  bVar2 = (ulong)dVar1 < 2;
                  if ((long)dVar1 < 0) {
                    bVar2 = ABS(dVar1) == 0.0;
                  }
                  if (bVar2) {
                    dVar1 = m->m[2][0];
                    bVar2 = (ulong)dVar1 < 2;
                    if ((long)dVar1 < 0) {
                      bVar2 = ABS(dVar1) == 0.0;
                    }
                    if (bVar2) {
                      dVar1 = m->m[2][1];
                      bVar2 = (ulong)dVar1 < 2;
                      if ((long)dVar1 < 0) {
                        bVar2 = ABS(dVar1) == 0.0;
                      }
                      if ((bVar2) && (dVar1 = m->m[2][2], -1 < (long)dVar1)) {
                        uVar4 = (long)dVar1 + 0xc010000000000000;
                        uVar3 = -uVar4;
                        if (0 < (long)uVar4) {
                          uVar3 = uVar4;
                        }
                        if (uVar3 < 2) {
                          dVar1 = m->m[2][3];
                          bVar2 = (ulong)dVar1 < 2;
                          if ((long)dVar1 < 0) {
                            bVar2 = ABS(dVar1) == 0.0;
                          }
                          if (bVar2) {
                            dVar1 = m->m[3][0];
                            bVar2 = (ulong)dVar1 < 2;
                            if ((long)dVar1 < 0) {
                              bVar2 = ABS(dVar1) == 0.0;
                            }
                            if (bVar2) {
                              dVar1 = m->m[3][1];
                              bVar2 = (ulong)dVar1 < 2;
                              if ((long)dVar1 < 0) {
                                bVar2 = ABS(dVar1) == 0.0;
                              }
                              if (bVar2) {
                                dVar1 = m->m[3][2];
                                bVar2 = (ulong)dVar1 < 2;
                                if ((long)dVar1 < 0) {
                                  bVar2 = ABS(dVar1) == 0.0;
                                }
                                if ((bVar2) && (dVar1 = m->m[3][3], -1 < (long)dVar1)) {
                                  uVar4 = (long)dVar1 + 0xc010000000000000;
                                  uVar3 = -uVar4;
                                  if (0 < (long)uVar4) {
                                    uVar3 = uVar4;
                                  }
                                  return uVar3 < 2;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix4d &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][1], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][2], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][3], 1.0, uint64_t(kIdentityMaxUlps));
}